

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmInfo.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmMultiAdapterContext::RemoveAdapterNode
          (GmmMultiAdapterContext *this,GMM_ADAPTER_INFO *pNode)

{
  GMM_ADAPTER_INFO *local_28;
  GMM_ADAPTER_INFO *pPrev;
  GMM_ADAPTER_INFO *pCur;
  GMM_ADAPTER_INFO *pNode_local;
  GmmMultiAdapterContext *this_local;
  
  local_28 = (GMM_ADAPTER_INFO *)0x0;
  pPrev = this->pHeadNode;
  while( true ) {
    if (pPrev == (GMM_ADAPTER_INFO *)0x0) {
      return;
    }
    if (pPrev == pNode) break;
    local_28 = pPrev;
    pPrev = pPrev->pNext;
  }
  if (local_28 == (GMM_ADAPTER_INFO *)0x0) {
    if (pNode == this->pHeadNode) {
      this->pHeadNode = pNode->pNext;
    }
  }
  else {
    local_28->pNext = pNode->pNext;
  }
  this->NumAdapters = this->NumAdapters - 1;
  free(pNode);
  return;
}

Assistant:

void GmmLib::GmmMultiAdapterContext::RemoveAdapterNode(GMM_ADAPTER_INFO *pNode)
{
    GMM_ADAPTER_INFO *pCur = NULL, *pPrev = NULL;

    // Find the node and remove the node from the list
    pCur = this->pHeadNode;
    while (pCur)
    {
        if (pCur == pNode)
        {
            if (pPrev)
            {
                // the node to be removed is in the middle of the list or the tail
                pPrev->pNext = pNode->pNext;
            }
            else if (pNode == this->pHeadNode)
            {
                // the node to be removed is the head of the list
                this->pHeadNode = pNode->pNext;
            }

            // Decrement the Adapter Node count tracker variable
            this->NumAdapters--;

            // Free the node that was removed from the list above.
            free(pNode);
            break;
        }
        pPrev = pCur;
        pCur  = pCur->pNext;
    }
    GMM_ASSERTDPF(pCur != NULL, "CRITICAL ERROR: Node to be released does not exist in list");
}